

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate_expression.cpp
# Opt level: O2

bool duckdb::CollateExpression::Equal(CollateExpression *a,CollateExpression *b)

{
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  type pPVar4;
  
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&a->child);
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&b->child);
  iVar2 = (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[10])(pPVar3,pPVar4);
  if ((char)iVar2 == '\0') {
    bVar1 = false;
  }
  else {
    bVar1 = ::std::operator!=(&a->collation,&b->collation);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool CollateExpression::Equal(const CollateExpression &a, const CollateExpression &b) {
	if (!a.child->Equals(*b.child)) {
		return false;
	}
	if (a.collation != b.collation) {
		return false;
	}
	return true;
}